

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

bool __thiscall
jrtplib::RTPUDPv6Transmitter::ComesFromThisTransmitter(RTPUDPv6Transmitter *this,RTPAddress *addr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  _List_node_base *p_Var4;
  undefined1 auVar5 [16];
  in6_addr addrip;
  in6_addr itip;
  
  if ((addr == (RTPAddress *)0x0) || (this->init == false)) {
    return false;
  }
  if ((this->created == true) && (addr->addresstype == IPv6Address)) {
    p_Var4 = (this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node.
             super__List_node_base._M_next;
    if (p_Var4 != (_List_node_base *)&this->localIPs) {
      uVar1 = *(undefined8 *)&addr->field_0xc;
      uVar2 = *(undefined8 *)((long)&addr[1]._vptr_RTPAddress + 4);
      bVar3 = false;
      do {
        addrip.__in6_u.__u6_addr8[0] = (uint8_t)uVar1;
        addrip.__in6_u.__u6_addr8[1] = (uint8_t)((ulong)uVar1 >> 8);
        addrip.__in6_u.__u6_addr8[2] = (uint8_t)((ulong)uVar1 >> 0x10);
        addrip.__in6_u.__u6_addr8[3] = (uint8_t)((ulong)uVar1 >> 0x18);
        addrip.__in6_u.__u6_addr8[4] = (uint8_t)((ulong)uVar1 >> 0x20);
        addrip.__in6_u.__u6_addr8[5] = (uint8_t)((ulong)uVar1 >> 0x28);
        addrip.__in6_u.__u6_addr8[6] = (uint8_t)((ulong)uVar1 >> 0x30);
        addrip.__in6_u.__u6_addr8[7] = (uint8_t)((ulong)uVar1 >> 0x38);
        addrip.__in6_u.__u6_addr8[8] = (uint8_t)uVar2;
        addrip.__in6_u.__u6_addr8[9] = (uint8_t)((ulong)uVar2 >> 8);
        addrip.__in6_u.__u6_addr8[10] = (uint8_t)((ulong)uVar2 >> 0x10);
        addrip.__in6_u.__u6_addr8[0xb] = (uint8_t)((ulong)uVar2 >> 0x18);
        addrip.__in6_u.__u6_addr8[0xc] = (uint8_t)((ulong)uVar2 >> 0x20);
        addrip.__in6_u.__u6_addr8[0xd] = (uint8_t)((ulong)uVar2 >> 0x28);
        addrip.__in6_u.__u6_addr8[0xe] = (uint8_t)((ulong)uVar2 >> 0x30);
        addrip.__in6_u.__u6_addr8[0xf] = (uint8_t)((ulong)uVar2 >> 0x38);
        auVar5[0] = -(addrip.__in6_u.__u6_addr8[0] == *(uint8_t *)&p_Var4[1]._M_next);
        auVar5[1] = -(addrip.__in6_u.__u6_addr8[1] == *(uint8_t *)((long)&p_Var4[1]._M_next + 1));
        auVar5[2] = -(addrip.__in6_u.__u6_addr8[2] == *(uint8_t *)((long)&p_Var4[1]._M_next + 2));
        auVar5[3] = -(addrip.__in6_u.__u6_addr8[3] == *(uint8_t *)((long)&p_Var4[1]._M_next + 3));
        auVar5[4] = -(addrip.__in6_u.__u6_addr8[4] == *(uint8_t *)((long)&p_Var4[1]._M_next + 4));
        auVar5[5] = -(addrip.__in6_u.__u6_addr8[5] == *(uint8_t *)((long)&p_Var4[1]._M_next + 5));
        auVar5[6] = -(addrip.__in6_u.__u6_addr8[6] == *(uint8_t *)((long)&p_Var4[1]._M_next + 6));
        auVar5[7] = -(addrip.__in6_u.__u6_addr8[7] == *(uint8_t *)((long)&p_Var4[1]._M_next + 7));
        auVar5[8] = -(addrip.__in6_u.__u6_addr8[8] == *(uint8_t *)&p_Var4[1]._M_prev);
        auVar5[9] = -(addrip.__in6_u.__u6_addr8[9] == *(uint8_t *)((long)&p_Var4[1]._M_prev + 1));
        auVar5[10] = -(addrip.__in6_u.__u6_addr8[10] == *(uint8_t *)((long)&p_Var4[1]._M_prev + 2));
        auVar5[0xb] = -(addrip.__in6_u.__u6_addr8[0xb] == *(uint8_t *)((long)&p_Var4[1]._M_prev + 3)
                       );
        auVar5[0xc] = -(addrip.__in6_u.__u6_addr8[0xc] == *(uint8_t *)((long)&p_Var4[1]._M_prev + 4)
                       );
        auVar5[0xd] = -(addrip.__in6_u.__u6_addr8[0xd] == *(uint8_t *)((long)&p_Var4[1]._M_prev + 5)
                       );
        auVar5[0xe] = -(addrip.__in6_u.__u6_addr8[0xe] == *(uint8_t *)((long)&p_Var4[1]._M_prev + 6)
                       );
        auVar5[0xf] = -(addrip.__in6_u.__u6_addr8[0xf] == *(uint8_t *)((long)&p_Var4[1]._M_prev + 7)
                       );
        if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
          bVar3 = true;
        }
        else {
          p_Var4 = p_Var4->_M_next;
        }
        if (bVar3) goto LAB_001258b3;
      } while (p_Var4 != (_List_node_base *)&this->localIPs);
      if (bVar3) {
LAB_001258b3:
        if (*(ushort *)&addr[1].field_0xc == this->portbase) {
          return true;
        }
        return this->portbase + 1 == (uint)*(ushort *)&addr[1].field_0xc;
      }
    }
  }
  return false;
}

Assistant:

bool RTPUDPv6Transmitter::ComesFromThisTransmitter(const RTPAddress *addr)
{
	if (!init)
		return false;

	if (addr == 0)
		return false;
	
	MAINMUTEX_LOCK
	
	bool v;
		
	if (created && addr->GetAddressType() == RTPAddress::IPv6Address)
	{	
		const RTPIPv6Address *addr2 = (const RTPIPv6Address *)addr;
		bool found = false;
		std::list<in6_addr>::const_iterator it;
	
		it = localIPs.begin();
		while (!found && it != localIPs.end())
		{
			in6_addr itip = *it;
			in6_addr addrip = addr2->GetIP();
			if (memcmp(&addrip,&itip,sizeof(in6_addr)) == 0)
				found = true;
			else
				++it;
		}
	
		if (!found)
			v = false;
		else
		{
			if (addr2->GetPort() == portbase) // check for RTP port
				v = true;
			else if (addr2->GetPort() == (portbase+1)) // check for RTCP port
				v = true;
			else 
				v = false;
		}
	}
	else
		v = false;

	MAINMUTEX_UNLOCK
	return v;
}